

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZDICT_optimizeTrainFromBuffer_fastCover
                 (void *dictBuffer,size_t dictBufferCapacity,void *samplesBuffer,
                 size_t *samplesSizes,uint nbSamples,ZDICT_fastCover_params_t *parameters)

{
  uint uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ulong uVar4;
  int displayLevel_00;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  ZDICT_cover_params_t parameters_00;
  ZDICT_cover_params_t coverParams_00;
  ZDICT_fastCover_params_t fastCoverParams;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  bool bVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  clock_t cVar16;
  ulong in_RSI;
  void *in_RDI;
  int in_R8D;
  ZDICT_fastCover_params_t *in_R9;
  size_t compressedSize;
  size_t dictSize;
  FASTCOVER_tryParameters_data_t *data;
  size_t initVal;
  FASTCOVER_ctx_t ctx;
  int warned;
  POOL_ctx *pool;
  COVER_best_t best;
  uint k;
  uint d;
  uint iteration;
  int displayLevel;
  uint shrinkDict;
  uint accel;
  uint f;
  uint kIterations;
  uint kStepSize;
  uint kSteps;
  uint kMaxK;
  uint kMinK;
  uint kMaxD;
  uint kMinD;
  double splitPoint;
  uint nbThreads;
  FASTCOVER_accel_t accelParams;
  ZDICT_cover_params_t coverParams;
  undefined4 uVar17;
  size_t in_stack_fffffffffffffdc8;
  POOL_function function;
  size_t in_stack_fffffffffffffdd0;
  POOL_ctx *ctx_00;
  int local_210;
  uint local_20c;
  uint local_208;
  uint local_200;
  uint local_1fc;
  uint local_1f8;
  uint local_1f4;
  uint local_1f0;
  uint local_1ec;
  double local_1e8;
  undefined8 in_stack_fffffffffffffe20;
  double in_stack_fffffffffffffe28;
  long *in_stack_fffffffffffffe30;
  size_t *in_stack_fffffffffffffe38;
  void *in_stack_fffffffffffffe40;
  FASTCOVER_ctx_t *in_stack_fffffffffffffe48;
  FASTCOVER_accel_t in_stack_fffffffffffffe60;
  POOL_ctx *local_168;
  undefined1 local_160 [32];
  void *in_stack_fffffffffffffec0;
  void *local_100;
  size_t local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  POOL_ctx *pPStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  size_t local_c0;
  uint local_b8;
  uint local_b4;
  int local_b0;
  ZDICT_cover_params_t local_68;
  ZDICT_fastCover_params_t *local_38;
  ulong local_18;
  void *local_10;
  size_t local_8;
  
  if (0.0 < in_R9->splitPoint) {
    local_1e8 = in_R9->splitPoint;
  }
  else {
    local_1e8 = 0.75;
  }
  if (in_R9->d == 0) {
    local_1ec = 6;
  }
  else {
    local_1ec = in_R9->d;
  }
  if (in_R9->d == 0) {
    local_1f0 = 8;
  }
  else {
    local_1f0 = in_R9->d;
  }
  if (in_R9->k == 0) {
    local_1f4 = 0x32;
  }
  else {
    local_1f4 = in_R9->k;
  }
  if (in_R9->k == 0) {
    local_1f8 = 2000;
  }
  else {
    local_1f8 = in_R9->k;
  }
  if (in_R9->steps == 0) {
    local_1fc = 0x28;
  }
  else {
    local_1fc = in_R9->steps;
  }
  if ((local_1f8 - local_1f4) / local_1fc < 2) {
    local_200 = 1;
  }
  else {
    local_200 = (local_1f8 - local_1f4) / local_1fc;
  }
  uVar4 = (ulong)(local_1f8 - local_1f4) % (ulong)local_200;
  uVar13 = ((local_1f0 - local_1ec >> 1) + 1) * ((local_1f8 - local_1f4) / local_200 + 1);
  if (in_R9->f == 0) {
    local_208 = 0x14;
  }
  else {
    local_208 = in_R9->f;
  }
  if (in_R9->accel == 0) {
    local_20c = 1;
  }
  else {
    local_20c = in_R9->accel;
  }
  uVar1 = (in_R9->zParams).notificationLevel;
  local_b0 = 1;
  local_168 = (POOL_ctx *)0x0;
  bVar12 = false;
  if ((local_1e8 <= 0.0) || (1.0 < local_1e8)) {
    if (0 < (int)uVar1) {
      fprintf(_stderr,"Incorrect splitPoint\n",uVar4);
      fflush(_stderr);
    }
    local_8 = 0xffffffffffffffd6;
  }
  else if ((local_20c == 0) || (10 < local_20c)) {
    if (0 < (int)uVar1) {
      fprintf(_stderr,"Incorrect accel\n",uVar4);
      fflush(_stderr);
    }
    local_8 = 0xffffffffffffffd6;
  }
  else if ((local_1f4 < local_1f0) || (local_1f8 < local_1f4)) {
    if (0 < (int)uVar1) {
      fprintf(_stderr,"Incorrect k\n",uVar4);
      fflush(_stderr);
    }
    local_8 = 0xffffffffffffffd6;
  }
  else if (in_R8D == 0) {
    if (0 < (int)uVar1) {
      fprintf(_stderr,"FASTCOVER must have at least one input file\n",uVar4);
      fflush(_stderr);
    }
    local_8 = 0xffffffffffffffb8;
  }
  else if (in_RSI < 0x100) {
    if (0 < (int)uVar1) {
      fprintf(_stderr,"dictBufferCapacity must be at least %u\n",0x100);
      fflush(_stderr);
    }
    local_8 = 0xffffffffffffffba;
  }
  else {
    local_38 = in_R9;
    local_18 = in_RSI;
    local_10 = in_RDI;
    if ((in_R9->nbThreads < 2) ||
       (local_168 = POOL_create(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8),
       local_168 != (POOL_ctx *)0x0)) {
      COVER_best_init((COVER_best_t *)0x296e0d);
      memset(&local_68,0,0x30);
      uVar2 = (local_38->zParams).notificationLevel;
      uVar3 = (local_38->zParams).dictID;
      fastCoverParams.zParams.dictID = uVar3;
      fastCoverParams.zParams.notificationLevel = uVar2;
      displayLevel_00 = local_38->steps;
      uVar9 = local_38->k;
      uVar10 = local_38->d;
      uVar11 = local_38->f;
      fastCoverParams.f = uVar11;
      fastCoverParams.d = uVar10;
      fastCoverParams.k = uVar9;
      function = *(POOL_function *)&local_38->nbThreads;
      ctx_00 = (POOL_ctx *)local_38->splitPoint;
      uVar5 = local_38->accel;
      uVar6 = local_38->shrinkDict;
      fastCoverParams.shrinkDict = uVar6;
      fastCoverParams.accel = uVar5;
      uVar7 = local_38->shrinkDictMaxRegression;
      uVar8 = (local_38->zParams).compressionLevel;
      fastCoverParams.zParams.compressionLevel = uVar8;
      fastCoverParams.shrinkDictMaxRegression = uVar7;
      fastCoverParams.steps = displayLevel_00;
      fastCoverParams._16_8_ = function;
      fastCoverParams.splitPoint = (double)ctx_00;
      FASTCOVER_convertToCoverParams(fastCoverParams,&local_68);
      if (uVar1 == 0) {
        local_210 = 0;
      }
      else {
        local_210 = uVar1 - 1;
      }
      g_displayLevel = local_210;
      if (1 < (int)uVar1) {
        fprintf(_stderr,"Trying %u different sets of parameters\n",(ulong)uVar13);
        fflush(_stderr);
      }
      for (local_b4 = local_1ec; local_b4 <= local_1f0; local_b4 = local_b4 + 2) {
        if (2 < (int)uVar1) {
          fprintf(_stderr,"d=%u\n",(ulong)local_b4);
          fflush(_stderr);
        }
        in_stack_fffffffffffffe38 =
             (size_t *)
             FASTCOVER_ctx_init(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                                in_stack_fffffffffffffe38,
                                (uint)((ulong)in_stack_fffffffffffffe30 >> 0x20),
                                (uint)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                                (uint)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                                in_stack_fffffffffffffe60);
        uVar14 = ZSTD_isError(0x296f8d);
        if (uVar14 != 0) {
          if (0 < (int)uVar1) {
            fprintf(_stderr,"Failed to initialize context\n");
            fflush(_stderr);
          }
          COVER_best_destroy((COVER_best_t *)0x296fd0);
          POOL_free(ctx_00);
          return (size_t)in_stack_fffffffffffffe38;
        }
        if (!bVar12) {
          COVER_warnOnSmallCorpus((size_t)ctx_00,(size_t)function,displayLevel_00);
          bVar12 = true;
        }
        for (local_b8 = local_1f4; local_b8 <= local_1f8; local_b8 = local_200 + local_b8) {
          in_stack_fffffffffffffe30 = (long *)malloc(0x48);
          if (2 < (int)uVar1) {
            fprintf(_stderr,"k=%u\n",(ulong)local_b8);
            fflush(_stderr);
          }
          if (in_stack_fffffffffffffe30 == (long *)0x0) {
            if (0 < (int)uVar1) {
              fprintf(_stderr,"Failed to allocate parameters\n");
              fflush(_stderr);
            }
            COVER_best_destroy((COVER_best_t *)0x2970d2);
            FASTCOVER_ctx_destroy((FASTCOVER_ctx_t *)0x2970df);
            POOL_free(ctx_00);
            return 0xffffffffffffffc0;
          }
          *in_stack_fffffffffffffe30 = (long)&stack0xfffffffffffffe40;
          in_stack_fffffffffffffe30[1] = (long)local_160;
          in_stack_fffffffffffffe30[2] = local_18;
          memcpy(in_stack_fffffffffffffe30 + 3,&local_68,0x30);
          *(uint *)(in_stack_fffffffffffffe30 + 3) = local_b8;
          *(uint *)((long)in_stack_fffffffffffffe30 + 0x1c) = local_b4;
          in_stack_fffffffffffffe30[5] = (long)local_1e8;
          *(uint *)(in_stack_fffffffffffffe30 + 4) = local_1fc;
          *(undefined4 *)(in_stack_fffffffffffffe30 + 6) = 0;
          *(int *)((long)in_stack_fffffffffffffe30 + 0x3c) = g_displayLevel;
          function = (POOL_function)in_stack_fffffffffffffe30[5];
          ctx_00 = (POOL_ctx *)in_stack_fffffffffffffe30[6];
          uVar17 = (undefined4)in_stack_fffffffffffffe30[4];
          displayLevel_00 = (int)((ulong)in_stack_fffffffffffffe30[4] >> 0x20);
          parameters_00.nbThreads = displayLevel_00;
          parameters_00._0_12_ = *(undefined1 (*) [12])(in_stack_fffffffffffffe30 + 3);
          parameters_00.splitPoint = (double)function;
          parameters_00._24_8_ = ctx_00;
          parameters_00.zParams._0_8_ = in_stack_fffffffffffffe30[7];
          parameters_00._40_8_ = in_stack_fffffffffffffe30[8];
          iVar15 = FASTCOVER_checkParameters
                             (parameters_00,local_18,*(uint *)(*in_stack_fffffffffffffe30 + 0x44),
                              local_20c);
          if (iVar15 == 0) {
            if (0 < g_displayLevel) {
              fprintf(_stderr,"FASTCOVER parameters incorrect\n");
              fflush(_stderr);
            }
            free(in_stack_fffffffffffffe30);
          }
          else {
            COVER_best_start((COVER_best_t *)0x297236);
            if (local_168 == (POOL_ctx *)0x0) {
              FASTCOVER_tryParameters(in_stack_fffffffffffffec0);
            }
            else {
              POOL_add(ctx_00,function,(void *)CONCAT44(displayLevel_00,uVar17));
            }
            if ((1 < (int)uVar1) &&
               ((cVar16 = clock(), 150000 < cVar16 - g_time || (3 < (int)uVar1)))) {
              g_time = clock();
              fprintf(_stderr,"\r%u%%       ",(ulong)(uint)(local_b0 * 100) / (ulong)uVar13);
              fflush(_stderr);
            }
            local_b0 = local_b0 + 1;
          }
        }
        COVER_best_wait((COVER_best_t *)0x29730e);
        FASTCOVER_ctx_destroy((FASTCOVER_ctx_t *)0x29731b);
      }
      if (1 < (int)uVar1) {
        fprintf(_stderr,"\r%79s\r","");
        fflush(_stderr);
      }
      uVar13 = ZSTD_isError(0x297383);
      if (uVar13 == 0) {
        coverParams_00.steps = (int)uStack_e8;
        coverParams_00._0_8_ = local_f0;
        coverParams_00.nbThreads = (int)((ulong)uStack_e8 >> 0x20);
        coverParams_00.splitPoint = (double)local_e0;
        coverParams_00._24_8_ = pPStack_d8;
        coverParams_00.zParams._0_8_ = local_d0;
        coverParams_00._40_8_ = uStack_c8;
        FASTCOVER_convertToFastCoverParams(coverParams_00,local_38,local_208,local_20c);
        memcpy(local_10,local_100,local_f8);
        COVER_best_destroy((COVER_best_t *)0x297428);
        POOL_free(pPStack_d8);
        local_8 = local_f8;
      }
      else {
        COVER_best_destroy((COVER_best_t *)0x2973a2);
        POOL_free(ctx_00);
        local_8 = local_c0;
      }
    }
    else {
      local_8 = 0xffffffffffffffc0;
    }
  }
  return local_8;
}

Assistant:

ZDICTLIB_API size_t
ZDICT_optimizeTrainFromBuffer_fastCover(
                    void* dictBuffer, size_t dictBufferCapacity,
                    const void* samplesBuffer,
                    const size_t* samplesSizes, unsigned nbSamples,
                    ZDICT_fastCover_params_t* parameters)
{
    ZDICT_cover_params_t coverParams;
    FASTCOVER_accel_t accelParams;
    /* constants */
    const unsigned nbThreads = parameters->nbThreads;
    const double splitPoint =
        parameters->splitPoint <= 0.0 ? FASTCOVER_DEFAULT_SPLITPOINT : parameters->splitPoint;
    const unsigned kMinD = parameters->d == 0 ? 6 : parameters->d;
    const unsigned kMaxD = parameters->d == 0 ? 8 : parameters->d;
    const unsigned kMinK = parameters->k == 0 ? 50 : parameters->k;
    const unsigned kMaxK = parameters->k == 0 ? 2000 : parameters->k;
    const unsigned kSteps = parameters->steps == 0 ? 40 : parameters->steps;
    const unsigned kStepSize = MAX((kMaxK - kMinK) / kSteps, 1);
    const unsigned kIterations =
        (1 + (kMaxD - kMinD) / 2) * (1 + (kMaxK - kMinK) / kStepSize);
    const unsigned f = parameters->f == 0 ? DEFAULT_F : parameters->f;
    const unsigned accel = parameters->accel == 0 ? DEFAULT_ACCEL : parameters->accel;
    const unsigned shrinkDict = 0;
    /* Local variables */
    const int displayLevel = (int)parameters->zParams.notificationLevel;
    unsigned iteration = 1;
    unsigned d;
    unsigned k;
    COVER_best_t best;
    POOL_ctx *pool = NULL;
    int warned = 0;
    /* Checks */
    if (splitPoint <= 0 || splitPoint > 1) {
      LOCALDISPLAYLEVEL(displayLevel, 1, "Incorrect splitPoint\n");
      return ERROR(parameter_outOfBound);
    }
    if (accel == 0 || accel > FASTCOVER_MAX_ACCEL) {
      LOCALDISPLAYLEVEL(displayLevel, 1, "Incorrect accel\n");
      return ERROR(parameter_outOfBound);
    }
    if (kMinK < kMaxD || kMaxK < kMinK) {
      LOCALDISPLAYLEVEL(displayLevel, 1, "Incorrect k\n");
      return ERROR(parameter_outOfBound);
    }
    if (nbSamples == 0) {
      LOCALDISPLAYLEVEL(displayLevel, 1, "FASTCOVER must have at least one input file\n");
      return ERROR(srcSize_wrong);
    }
    if (dictBufferCapacity < ZDICT_DICTSIZE_MIN) {
      LOCALDISPLAYLEVEL(displayLevel, 1, "dictBufferCapacity must be at least %u\n",
                   ZDICT_DICTSIZE_MIN);
      return ERROR(dstSize_tooSmall);
    }
    if (nbThreads > 1) {
      pool = POOL_create(nbThreads, 1);
      if (!pool) {
        return ERROR(memory_allocation);
      }
    }
    /* Initialization */
    COVER_best_init(&best);
    memset(&coverParams, 0 , sizeof(coverParams));
    FASTCOVER_convertToCoverParams(*parameters, &coverParams);
    accelParams = FASTCOVER_defaultAccelParameters[accel];
    /* Turn down global display level to clean up display at level 2 and below */
    g_displayLevel = displayLevel == 0 ? 0 : displayLevel - 1;
    /* Loop through d first because each new value needs a new context */
    LOCALDISPLAYLEVEL(displayLevel, 2, "Trying %u different sets of parameters\n",
                      kIterations);
    for (d = kMinD; d <= kMaxD; d += 2) {
      /* Initialize the context for this value of d */
      FASTCOVER_ctx_t ctx;
      LOCALDISPLAYLEVEL(displayLevel, 3, "d=%u\n", d);
      {
        size_t const initVal = FASTCOVER_ctx_init(&ctx, samplesBuffer, samplesSizes, nbSamples, d, splitPoint, f, accelParams);
        if (ZSTD_isError(initVal)) {
          LOCALDISPLAYLEVEL(displayLevel, 1, "Failed to initialize context\n");
          COVER_best_destroy(&best);
          POOL_free(pool);
          return initVal;
        }
      }
      if (!warned) {
        COVER_warnOnSmallCorpus(dictBufferCapacity, ctx.nbDmers, displayLevel);
        warned = 1;
      }
      /* Loop through k reusing the same context */
      for (k = kMinK; k <= kMaxK; k += kStepSize) {
        /* Prepare the arguments */
        FASTCOVER_tryParameters_data_t *data = (FASTCOVER_tryParameters_data_t *)malloc(
            sizeof(FASTCOVER_tryParameters_data_t));
        LOCALDISPLAYLEVEL(displayLevel, 3, "k=%u\n", k);
        if (!data) {
          LOCALDISPLAYLEVEL(displayLevel, 1, "Failed to allocate parameters\n");
          COVER_best_destroy(&best);
          FASTCOVER_ctx_destroy(&ctx);
          POOL_free(pool);
          return ERROR(memory_allocation);
        }
        data->ctx = &ctx;
        data->best = &best;
        data->dictBufferCapacity = dictBufferCapacity;
        data->parameters = coverParams;
        data->parameters.k = k;
        data->parameters.d = d;
        data->parameters.splitPoint = splitPoint;
        data->parameters.steps = kSteps;
        data->parameters.shrinkDict = shrinkDict;
        data->parameters.zParams.notificationLevel = (unsigned)g_displayLevel;
        /* Check the parameters */
        if (!FASTCOVER_checkParameters(data->parameters, dictBufferCapacity,
                                       data->ctx->f, accel)) {
          DISPLAYLEVEL(1, "FASTCOVER parameters incorrect\n");
          free(data);
          continue;
        }
        /* Call the function and pass ownership of data to it */
        COVER_best_start(&best);
        if (pool) {
          POOL_add(pool, &FASTCOVER_tryParameters, data);
        } else {
          FASTCOVER_tryParameters(data);
        }
        /* Print status */
        LOCALDISPLAYUPDATE(displayLevel, 2, "\r%u%%       ",
                           (unsigned)((iteration * 100) / kIterations));
        ++iteration;
      }
      COVER_best_wait(&best);
      FASTCOVER_ctx_destroy(&ctx);
    }
    LOCALDISPLAYLEVEL(displayLevel, 2, "\r%79s\r", "");
    /* Fill the output buffer and parameters with output of the best parameters */
    {
      const size_t dictSize = best.dictSize;
      if (ZSTD_isError(best.compressedSize)) {
        const size_t compressedSize = best.compressedSize;
        COVER_best_destroy(&best);
        POOL_free(pool);
        return compressedSize;
      }
      FASTCOVER_convertToFastCoverParams(best.parameters, parameters, f, accel);
      memcpy(dictBuffer, best.dict, dictSize);
      COVER_best_destroy(&best);
      POOL_free(pool);
      return dictSize;
    }

}